

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

int get_param_part(OperationConfig *config,char endchar,char **str,char **pdata,char **ptype,
                  char **pfilename,char **pencoder,curl_slist **pheaders)

{
  byte bVar1;
  GlobalConfig *config_00;
  FILE *pFVar2;
  curl_slist *pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  FILE *__stream;
  curl_slist *pcVar11;
  int *piVar12;
  char *pcVar13;
  uint uVar14;
  byte *pbVar15;
  byte *pbVar16;
  undefined7 in_register_00000031;
  curl_slist *pcVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  byte *pbVar22;
  char type_minor [128];
  char type_major [128];
  byte *local_588;
  byte *local_580;
  uint local_574;
  curl_slist *local_570;
  int local_568;
  uint local_564;
  char **local_560;
  uint local_554;
  OperationConfig *local_550;
  byte *local_548;
  byte *local_540;
  char **local_538;
  byte *local_530;
  char **local_528;
  byte *local_520;
  char local_518 [1256];
  
  local_564 = (uint)CONCAT71(in_register_00000031,endchar);
  local_588 = (byte *)*str;
  local_518[0xf0] = '\0';
  local_518[0xf1] = '\0';
  local_518[0xf2] = '\0';
  local_518[0xf3] = '\0';
  local_518[0xf4] = '\0';
  local_518[0xf5] = '\0';
  local_518[0xf6] = '\0';
  local_518[0xf7] = '\0';
  local_518[0xf8] = '\0';
  local_518[0xf9] = '\0';
  local_518[0xfa] = '\0';
  local_518[0xfb] = '\0';
  local_518[0xfc] = '\0';
  local_518[0xfd] = '\0';
  local_518[0xfe] = '\0';
  local_518[0xff] = '\0';
  local_518[0xe0] = '\0';
  local_518[0xe1] = '\0';
  local_518[0xe2] = '\0';
  local_518[0xe3] = '\0';
  local_518[0xe4] = '\0';
  local_518[0xe5] = '\0';
  local_518[0xe6] = '\0';
  local_518[0xe7] = '\0';
  local_518[0xe8] = '\0';
  local_518[0xe9] = '\0';
  local_518[0xea] = '\0';
  local_518[0xeb] = '\0';
  local_518[0xec] = '\0';
  local_518[0xed] = '\0';
  local_518[0xee] = '\0';
  local_518[0xef] = '\0';
  local_518[0xd0] = '\0';
  local_518[0xd1] = '\0';
  local_518[0xd2] = '\0';
  local_518[0xd3] = '\0';
  local_518[0xd4] = '\0';
  local_518[0xd5] = '\0';
  local_518[0xd6] = '\0';
  local_518[0xd7] = '\0';
  local_518[0xd8] = '\0';
  local_518[0xd9] = '\0';
  local_518[0xda] = '\0';
  local_518[0xdb] = '\0';
  local_518[0xdc] = '\0';
  local_518[0xdd] = '\0';
  local_518[0xde] = '\0';
  local_518[0xdf] = '\0';
  local_518[0xc0] = '\0';
  local_518[0xc1] = '\0';
  local_518[0xc2] = '\0';
  local_518[0xc3] = '\0';
  local_518[0xc4] = '\0';
  local_518[0xc5] = '\0';
  local_518[0xc6] = '\0';
  local_518[199] = '\0';
  local_518[200] = '\0';
  local_518[0xc9] = '\0';
  local_518[0xca] = '\0';
  local_518[0xcb] = '\0';
  local_518[0xcc] = '\0';
  local_518[0xcd] = '\0';
  local_518[0xce] = '\0';
  local_518[0xcf] = '\0';
  local_518[0xb0] = '\0';
  local_518[0xb1] = '\0';
  local_518[0xb2] = '\0';
  local_518[0xb3] = '\0';
  local_518[0xb4] = '\0';
  local_518[0xb5] = '\0';
  local_518[0xb6] = '\0';
  local_518[0xb7] = '\0';
  local_518[0xb8] = '\0';
  local_518[0xb9] = '\0';
  local_518[0xba] = '\0';
  local_518[0xbb] = '\0';
  local_518[0xbc] = '\0';
  local_518[0xbd] = '\0';
  local_518[0xbe] = '\0';
  local_518[0xbf] = '\0';
  local_518[0xa0] = '\0';
  local_518[0xa1] = '\0';
  local_518[0xa2] = '\0';
  local_518[0xa3] = '\0';
  local_518[0xa4] = '\0';
  local_518[0xa5] = '\0';
  local_518[0xa6] = '\0';
  local_518[0xa7] = '\0';
  local_518[0xa8] = '\0';
  local_518[0xa9] = '\0';
  local_518[0xaa] = '\0';
  local_518[0xab] = '\0';
  local_518[0xac] = '\0';
  local_518[0xad] = '\0';
  local_518[0xae] = '\0';
  local_518[0xaf] = '\0';
  local_518[0x90] = '\0';
  local_518[0x91] = '\0';
  local_518[0x92] = '\0';
  local_518[0x93] = '\0';
  local_518[0x94] = '\0';
  local_518[0x95] = '\0';
  local_518[0x96] = '\0';
  local_518[0x97] = '\0';
  local_518[0x98] = '\0';
  local_518[0x99] = '\0';
  local_518[0x9a] = '\0';
  local_518[0x9b] = '\0';
  local_518[0x9c] = '\0';
  local_518[0x9d] = '\0';
  local_518[0x9e] = '\0';
  local_518[0x9f] = '\0';
  local_518[0x80] = '\0';
  local_518[0x81] = '\0';
  local_518[0x82] = '\0';
  local_518[0x83] = '\0';
  local_518[0x84] = '\0';
  local_518[0x85] = '\0';
  local_518[0x86] = '\0';
  local_518[0x87] = '\0';
  local_518[0x88] = '\0';
  local_518[0x89] = '\0';
  local_518[0x8a] = '\0';
  local_518[0x8b] = '\0';
  local_518[0x8c] = '\0';
  local_518[0x8d] = '\0';
  local_518[0x8e] = '\0';
  local_518[0x8f] = '\0';
  local_518[0x70] = '\0';
  local_518[0x71] = '\0';
  local_518[0x72] = '\0';
  local_518[0x73] = '\0';
  local_518[0x74] = '\0';
  local_518[0x75] = '\0';
  local_518[0x76] = '\0';
  local_518[0x77] = '\0';
  local_518[0x78] = '\0';
  local_518[0x79] = '\0';
  local_518[0x7a] = '\0';
  local_518[0x7b] = '\0';
  local_518[0x7c] = '\0';
  local_518[0x7d] = '\0';
  local_518[0x7e] = '\0';
  local_518[0x7f] = '\0';
  local_518[0x60] = '\0';
  local_518[0x61] = '\0';
  local_518[0x62] = '\0';
  local_518[99] = '\0';
  local_518[100] = '\0';
  local_518[0x65] = '\0';
  local_518[0x66] = '\0';
  local_518[0x67] = '\0';
  local_518[0x68] = '\0';
  local_518[0x69] = '\0';
  local_518[0x6a] = '\0';
  local_518[0x6b] = '\0';
  local_518[0x6c] = '\0';
  local_518[0x6d] = '\0';
  local_518[0x6e] = '\0';
  local_518[0x6f] = '\0';
  local_518[0x50] = '\0';
  local_518[0x51] = '\0';
  local_518[0x52] = '\0';
  local_518[0x53] = '\0';
  local_518[0x54] = '\0';
  local_518[0x55] = '\0';
  local_518[0x56] = '\0';
  local_518[0x57] = '\0';
  local_518[0x58] = '\0';
  local_518[0x59] = '\0';
  local_518[0x5a] = '\0';
  local_518[0x5b] = '\0';
  local_518[0x5c] = '\0';
  local_518[0x5d] = '\0';
  local_518[0x5e] = '\0';
  local_518[0x5f] = '\0';
  local_518[0x40] = '\0';
  local_518[0x41] = '\0';
  local_518[0x42] = '\0';
  local_518[0x43] = '\0';
  local_518[0x44] = '\0';
  local_518[0x45] = '\0';
  local_518[0x46] = '\0';
  local_518[0x47] = '\0';
  local_518[0x48] = '\0';
  local_518[0x49] = '\0';
  local_518[0x4a] = '\0';
  local_518[0x4b] = '\0';
  local_518[0x4c] = '\0';
  local_518[0x4d] = '\0';
  local_518[0x4e] = '\0';
  local_518[0x4f] = '\0';
  local_518[0x30] = '\0';
  local_518[0x31] = '\0';
  local_518[0x32] = '\0';
  local_518[0x33] = '\0';
  local_518[0x34] = '\0';
  local_518[0x35] = '\0';
  local_518[0x36] = '\0';
  local_518[0x37] = '\0';
  local_518[0x38] = '\0';
  local_518[0x39] = '\0';
  local_518[0x3a] = '\0';
  local_518[0x3b] = '\0';
  local_518[0x3c] = '\0';
  local_518[0x3d] = '\0';
  local_518[0x3e] = '\0';
  local_518[0x3f] = '\0';
  local_518[0x20] = '\0';
  local_518[0x21] = '\0';
  local_518[0x22] = '\0';
  local_518[0x23] = '\0';
  local_518[0x24] = '\0';
  local_518[0x25] = '\0';
  local_518[0x26] = '\0';
  local_518[0x27] = '\0';
  local_518[0x28] = '\0';
  local_518[0x29] = '\0';
  local_518[0x2a] = '\0';
  local_518[0x2b] = '\0';
  local_518[0x2c] = '\0';
  local_518[0x2d] = '\0';
  local_518[0x2e] = '\0';
  local_518[0x2f] = '\0';
  local_518[0x10] = '\0';
  local_518[0x11] = '\0';
  local_518[0x12] = '\0';
  local_518[0x13] = '\0';
  local_518[0x14] = '\0';
  local_518[0x15] = '\0';
  local_518[0x16] = '\0';
  local_518[0x17] = '\0';
  local_518[0x18] = '\0';
  local_518[0x19] = '\0';
  local_518[0x1a] = '\0';
  local_518[0x1b] = '\0';
  local_518[0x1c] = '\0';
  local_518[0x1d] = '\0';
  local_518[0x1e] = '\0';
  local_518[0x1f] = '\0';
  local_518[0] = '\0';
  local_518[1] = '\0';
  local_518[2] = '\0';
  local_518[3] = '\0';
  local_518[4] = '\0';
  local_518[5] = '\0';
  local_518[6] = '\0';
  local_518[7] = '\0';
  local_518[8] = '\0';
  local_518[9] = '\0';
  local_518[10] = '\0';
  local_518[0xb] = '\0';
  local_518[0xc] = '\0';
  local_518[0xd] = '\0';
  local_518[0xe] = '\0';
  local_518[0xf] = '\0';
  if (ptype != (char **)0x0) {
    *ptype = (char *)0x0;
  }
  if (pfilename != (char **)0x0) {
    *pfilename = (char *)0x0;
  }
  if (pheaders != (curl_slist **)0x0) {
    *pheaders = (curl_slist *)0x0;
  }
  if (pencoder != (char **)0x0) {
    *pencoder = (char *)0x0;
  }
  pbVar22 = local_588 + -1;
  local_538 = pfilename;
  local_528 = ptype;
  do {
    pbVar7 = pbVar22 + 1;
    pbVar22 = pbVar22 + 1;
    iVar4 = Curl_isspace((uint)*pbVar7);
  } while (iVar4 != 0);
  local_568 = (int)(char)(byte)local_564;
  local_588 = pbVar22;
  pbVar7 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(byte)local_564);
  *pdata = (char *)pbVar7;
  if ((pbVar22 == pbVar7) && (pbVar7 = local_580, pbVar22 < local_580)) {
    do {
      iVar4 = Curl_isspace((uint)pbVar7[-1]);
      local_580 = pbVar7;
      if (iVar4 == 0) break;
      local_580 = pbVar7 + -1;
      pbVar7 = local_580;
    } while (*pdata < local_580);
  }
  bVar1 = *local_588;
  uVar14 = (uint)bVar1;
  *local_580 = 0;
  if (bVar1 == 0x3b) {
    local_540 = (byte *)0x0;
    pbVar22 = (byte *)0x0;
    local_548 = (byte *)0x0;
    local_570 = (curl_slist *)0x0;
    pbVar7 = local_588;
    local_560 = str;
    pbVar16 = (byte *)0x0;
    do {
      do {
        pbVar10 = pbVar7;
        pbVar7 = pbVar10 + 1;
        iVar4 = Curl_isspace((uint)pbVar10[1]);
      } while (iVar4 != 0);
      local_588 = pbVar7;
      if (pbVar16 == (byte *)0x0) {
        iVar4 = curl_strnequal("type=",pbVar7,5);
        if (iVar4 != 0) {
          pbVar7 = pbVar10 + 6;
          local_530 = pbVar22;
          do {
            pbVar10 = pbVar7;
            local_588 = pbVar10;
            iVar4 = Curl_isspace((uint)*pbVar10);
            pbVar7 = pbVar10 + 1;
          } while (iVar4 != 0);
          iVar4 = __isoc99_sscanf(pbVar10,"%127[^/ ]/%127[^;, \n]",local_518 + 0x80,local_518);
          pbVar22 = local_530;
          if (iVar4 != 2) {
            warnf(config->global,"Illegally formatted content-type field!\n");
            pcVar17 = local_570;
            goto LAB_0010e8a0;
          }
          local_540 = pbVar10;
          sVar8 = strlen(local_518 + 0x80);
          sVar9 = strlen(local_518);
          pbVar7 = pbVar10 + 1 + sVar9 + sVar8;
          pbVar15 = pbVar7;
          while( true ) {
            bVar1 = *pbVar7;
            str = local_560;
            uVar14 = (uint)bVar1;
            if ((bVar1 == 0) || (bVar1 == 0x3b)) break;
            uVar14 = local_564;
            local_588 = pbVar7;
            if (bVar1 == (byte)local_564) goto LAB_0010e6dc;
            iVar4 = Curl_isspace((uint)bVar1);
            pbVar7 = pbVar7 + 1;
            if (iVar4 == 0) {
              pbVar15 = pbVar7;
            }
          }
          goto LAB_0010e477;
        }
        iVar4 = curl_strnequal("filename=",pbVar7,9);
        if (iVar4 != 0) goto LAB_0010e10a;
        iVar4 = curl_strnequal("headers=",pbVar7,8);
        if (iVar4 != 0) goto LAB_0010e265;
        iVar4 = curl_strnequal("encoder=",pbVar7,8);
        if (iVar4 != 0) goto LAB_0010e38c;
        pcVar13 = get_param_word((char **)&local_588,(char **)&local_580,(char)local_568);
        uVar14 = (uint)*local_588;
        *local_580 = 0;
        if (*pcVar13 != '\0') {
          warnf(config->global,"skip unknown form field: %s\n",pcVar13);
        }
LAB_0010e16c:
        pbVar15 = (byte *)0x0;
        pbVar7 = local_588;
      }
      else {
        iVar4 = curl_strnequal("filename=",pbVar7,9);
        if (iVar4 != 0) {
          *pbVar16 = 0;
LAB_0010e10a:
          pbVar7 = local_588 + 8;
          do {
            pbVar22 = pbVar7 + 1;
            pbVar7 = pbVar7 + 1;
            iVar4 = Curl_isspace((uint)*pbVar22);
          } while (iVar4 != 0);
          local_588 = pbVar7;
          pbVar22 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_568);
          pbVar16 = local_580;
          if (pbVar7 == pbVar22) {
            while ((pbVar7 < pbVar16 && (iVar4 = Curl_isspace((uint)pbVar16[-1]), iVar4 != 0))) {
              pbVar16 = pbVar16 + -1;
            }
          }
LAB_0010e161:
          local_580 = pbVar16;
          uVar14 = (uint)*local_588;
          *local_580 = 0;
          goto LAB_0010e16c;
        }
        iVar4 = curl_strnequal("headers=",pbVar7,8);
        if (iVar4 == 0) {
          iVar4 = curl_strnequal("encoder=",pbVar7,8);
          pbVar15 = pbVar7;
          pbVar7 = local_588;
          if (iVar4 != 0) {
            *pbVar16 = 0;
LAB_0010e38c:
            pbVar7 = local_588 + 7;
            do {
              pbVar16 = pbVar7 + 1;
              pbVar7 = pbVar7 + 1;
              iVar4 = Curl_isspace((uint)*pbVar16);
            } while (iVar4 != 0);
            local_588 = pbVar7;
            local_548 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,
                                               (char)local_568);
            pbVar16 = local_580;
            if (pbVar7 == local_548) {
              while ((pbVar7 < pbVar16 && (iVar4 = Curl_isspace((uint)pbVar16[-1]), iVar4 != 0))) {
                pbVar16 = pbVar16 + -1;
              }
            }
            goto LAB_0010e161;
          }
          while( true ) {
            bVar1 = *pbVar7;
            uVar14 = (uint)bVar1;
            if (((bVar1 == 0) || (bVar1 == 0x3b)) || (uVar14 = local_564, bVar1 == (byte)local_564))
            break;
            iVar4 = Curl_isspace((uint)bVar1);
            pbVar7 = pbVar7 + 1;
            if (iVar4 == 0) {
              pbVar15 = pbVar7;
            }
          }
        }
        else {
          *pbVar16 = 0;
LAB_0010e265:
          if ((local_588[8] == 0x3c) || (local_588[8] == 0x40)) {
            pbVar7 = local_588 + 8;
            do {
              pbVar16 = pbVar7 + 1;
              pbVar7 = pbVar7 + 1;
              iVar4 = Curl_isspace((uint)*pbVar16);
            } while (iVar4 != 0);
            local_588 = pbVar7;
            pbVar10 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_568
                                            );
            pbVar16 = local_580;
            if (pbVar7 == pbVar10) {
              while ((pbVar7 < pbVar16 && (iVar4 = Curl_isspace((uint)pbVar16[-1]), iVar4 != 0))) {
                pbVar16 = pbVar16 + -1;
              }
            }
            local_580 = pbVar16;
            bVar1 = *local_588;
            *local_580 = 0;
            pbVar7 = local_588;
            __stream = fopen64((char *)pbVar10,"r");
            uVar14 = (uint)bVar1;
            if (__stream != (FILE *)0x0) {
              local_554 = 1;
              uVar19 = 0;
              local_550 = config;
              local_530 = pbVar22;
              local_520 = pbVar10;
LAB_0010e4d3:
              lVar20 = 0;
              do {
                local_574 = 0;
LAB_0010e4de:
                do {
                  do {
                    lVar21 = lVar20;
                    uVar5 = getc(__stream);
                    pcVar11 = (curl_slist *)(ulong)uVar5;
                    if (uVar5 == 0xffffffff) {
LAB_0010e503:
                      do {
                        uVar18 = uVar19;
                        pcVar3 = local_570;
                        if (uVar18 == 0) goto LAB_0010e54a;
                        uVar6 = Curl_isspace((uint)(byte)local_518[uVar18 + 0xff]);
                        pcVar17 = local_570;
                        pcVar11 = (curl_slist *)(ulong)uVar6;
                        uVar19 = uVar18 - 1;
                      } while (uVar6 != 0);
                      local_518[uVar18 + 0x100] = '\0';
                      pcVar11 = (curl_slist *)curl_slist_append(local_570,local_518 + 0x100);
                      pcVar3 = pcVar11;
                      if (pcVar11 != (curl_slist *)0x0) {
LAB_0010e54a:
                        local_570 = pcVar3;
                        uVar19 = 0;
                        goto LAB_0010e54d;
                      }
                      curl_mfprintf(local_550->global->errors,"Out of memory for field headers!\n");
LAB_0010e84a:
                      fclose(__stream);
                      goto LAB_0010e8a0;
                    }
                    if (lVar21 == 0) {
                      uVar6 = Curl_isspace(uVar5 & 0xff);
                      pcVar11 = (curl_slist *)(ulong)uVar6;
                      if (uVar6 == 0) goto LAB_0010e503;
                    }
LAB_0010e54d:
                    lVar20 = lVar21;
                  } while (uVar5 == 0xd);
                  if (uVar5 == 0x23) {
                    pbVar7 = (byte *)CONCAT71((int7)((ulong)pbVar7 >> 8),1);
                    uVar6 = local_574 & 1;
                    lVar20 = lVar21 + 1;
                    local_574 = (uint)pbVar7;
                    if (lVar21 == 0 || uVar6 != 0) goto LAB_0010e4de;
                  }
                  else {
                    if (uVar5 == 10) {
                      local_554 = local_554 + 1;
                      goto LAB_0010e4d3;
                    }
                    if (uVar5 == 0xffffffff) {
                      iVar4 = ferror(__stream);
                      if (iVar4 != 0) {
                        pFVar2 = local_550->global->errors;
                        piVar12 = __errno_location();
                        pcVar13 = strerror(*piVar12);
                        curl_mfprintf(pFVar2,"Header file %s read error: %s\n",local_520,pcVar13);
                        pcVar17 = local_570;
                        goto LAB_0010e84a;
                      }
                      fclose(__stream);
                      pbVar15 = (byte *)0x0;
                      str = local_560;
                      pbVar22 = local_530;
                      config = local_550;
                      pbVar7 = local_588;
                      goto LAB_0010e477;
                    }
                    uVar6 = local_574 & 1;
                    local_574 = (uint)CONCAT71((int7)((ulong)pcVar11 >> 8),1);
                    lVar20 = lVar21 + 1;
                    if (uVar6 != 0) goto LAB_0010e4de;
                  }
                  lVar20 = lVar21 + 1;
                  if (uVar19 == 0x3e6) {
                    pbVar7 = (byte *)(ulong)local_554;
                    warnf(local_550->global,"File %s line %d: header too long (truncated)\n",
                          local_520,pbVar7);
                    uVar5 = 0x20;
                    break;
                  }
                  local_574 = 0;
                } while (0x3e6 < uVar19);
                local_518[uVar19 + 0x100] = (char)uVar5;
                uVar19 = uVar19 + 1;
              } while( true );
            }
            config_00 = config->global;
            piVar12 = __errno_location();
            pcVar13 = strerror(*piVar12);
            warnf(config_00,"Cannot read from %s: %s\n",pbVar10,pcVar13);
            pbVar15 = (byte *)0x0;
            str = local_560;
            pbVar7 = local_588;
          }
          else {
            pbVar7 = local_588 + 7;
            do {
              pbVar16 = pbVar7 + 1;
              pbVar7 = pbVar7 + 1;
              iVar4 = Curl_isspace((uint)*pbVar16);
            } while (iVar4 != 0);
            local_588 = pbVar7;
            pbVar10 = (byte *)get_param_word((char **)&local_588,(char **)&local_580,(char)local_568
                                            );
            pbVar16 = local_580;
            if (pbVar7 == pbVar10) {
              while ((pbVar7 < pbVar16 && (iVar4 = Curl_isspace((uint)pbVar16[-1]), iVar4 != 0))) {
                pbVar16 = pbVar16 + -1;
              }
            }
            local_580 = pbVar16;
            pcVar17 = local_570;
            bVar1 = *local_588;
            *local_580 = 0;
            pcVar11 = (curl_slist *)curl_slist_append(local_570,pbVar10);
            if (pcVar11 == (curl_slist *)0x0) {
              curl_mfprintf(config->global->errors,"Out of memory for field header!\n");
LAB_0010e8a0:
              curl_slist_free_all(pcVar17);
              return -1;
            }
            pbVar15 = (byte *)0x0;
            str = local_560;
            uVar14 = (uint)bVar1;
            pbVar7 = local_588;
            local_570 = pcVar11;
          }
        }
      }
LAB_0010e477:
      local_588 = pbVar7;
      pbVar7 = local_588;
      pbVar10 = local_540;
      pbVar16 = pbVar15;
    } while ((char)uVar14 == ';');
LAB_0010e6dc:
    local_540 = pbVar10;
    if (pbVar15 != (byte *)0x0) {
      *pbVar15 = 0;
    }
    uVar14 = uVar14 & 0xff;
    pbVar7 = local_540;
    if (local_528 == (char **)0x0) {
      if (local_540 != (byte *)0x0) {
        warnf(config->global,"Field content type not allowed here: %s\n");
      }
    }
    else {
LAB_0010e70e:
      *local_528 = (char *)pbVar7;
    }
    if (local_538 == (char **)0x0) {
      if (pbVar22 != (byte *)0x0) {
        warnf(config->global,"Field file name not allowed here: %s\n",pbVar22);
      }
    }
    else {
LAB_0010e760:
      *local_538 = (char *)pbVar22;
    }
    pbVar22 = local_548;
    if (pencoder == (char **)0x0) {
      if (local_548 != (byte *)0x0) {
        warnf(config->global,"Field encoder not allowed here: %s\n");
      }
    }
    else {
LAB_0010e76d:
      *pencoder = (char *)pbVar22;
    }
    pcVar17 = local_570;
    if (pheaders == (curl_slist **)0x0) {
      if (local_570 != (curl_slist *)0x0) {
        warnf(config->global,"Field headers not allowed here: %s\n",local_570->data);
        curl_slist_free_all(pcVar17);
      }
      goto LAB_0010e7c6;
    }
  }
  else {
    if (local_528 != (char **)0x0) {
      local_570 = (curl_slist *)0x0;
      local_548 = (byte *)0x0;
      pbVar22 = (byte *)0x0;
      pbVar7 = (byte *)0x0;
      goto LAB_0010e70e;
    }
    if (local_538 != (char **)0x0) {
      pbVar22 = (byte *)0x0;
      local_548 = (byte *)0x0;
      local_570 = (curl_slist *)0x0;
      goto LAB_0010e760;
    }
    if (pencoder != (char **)0x0) {
      local_570 = (curl_slist *)0x0;
      pbVar22 = (byte *)0x0;
      goto LAB_0010e76d;
    }
    if (pheaders == (curl_slist **)0x0) goto LAB_0010e7c6;
    local_570 = (curl_slist *)0x0;
  }
  *pheaders = local_570;
LAB_0010e7c6:
  *str = (char *)local_588;
  return uVar14;
}

Assistant:

static int get_param_part(struct OperationConfig *config, char endchar,
                          char **str, char **pdata, char **ptype,
                          char **pfilename, char **pencoder,
                          struct curl_slist **pheaders)
{
  char *p = *str;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  char *endpos;
  char *tp;
  char sep;
  char type_major[128] = "";
  char type_minor[128] = "";
  char *endct = NULL;
  struct curl_slist *headers = NULL;

  if(ptype)
    *ptype = NULL;
  if(pfilename)
    *pfilename = NULL;
  if(pheaders)
    *pheaders = NULL;
  if(pencoder)
    *pencoder = NULL;
  while(ISSPACE(*p))
    p++;
  tp = p;
  *pdata = get_param_word(&p, &endpos, endchar);
  /* If not quoted, strip trailing spaces. */
  if(*pdata == tp)
    while(endpos > *pdata && ISSPACE(endpos[-1]))
      endpos--;
  sep = *p;
  *endpos = '\0';
  while(sep == ';') {
    while(ISSPACE(*++p))
      ;

    if(!endct && checkprefix("type=", p)) {
      for(p += 5; ISSPACE(*p); p++)
        ;
      /* set type pointer */
      type = p;

      /* verify that this is a fine type specifier */
      if(2 != sscanf(type, "%127[^/ ]/%127[^;, \n]", type_major, type_minor)) {
        warnf(config->global, "Illegally formatted content-type field!\n");
        curl_slist_free_all(headers);
        return -1; /* illegal content-type syntax! */
      }

      /* now point beyond the content-type specifier */
      p = type + strlen(type_major) + strlen(type_minor) + 1;
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else if(checkprefix("filename=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 9; ISSPACE(*p); p++)
        ;
      tp = p;
      filename = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(filename == tp)
        while(endpos > filename && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(checkprefix("headers=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      p += 8;
      if(*p == '@' || *p == '<') {
        char *hdrfile;
        FILE *fp;
        /* Read headers from a file. */

        do {
          p++;
        } while(ISSPACE(*p));
        tp = p;
        hdrfile = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdrfile == tp)
          while(endpos > hdrfile && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        /* TODO: maybe special fopen for VMS? */
        fp = fopen(hdrfile, FOPEN_READTEXT);
        if(!fp)
          warnf(config->global, "Cannot read from %s: %s\n", hdrfile,
                strerror(errno));
        else {
          int i = read_field_headers(config, hdrfile, fp, &headers);

          fclose(fp);
          if(i) {
            curl_slist_free_all(headers);
            return -1;
          }
        }
      }
      else {
        char *hdr;

        while(ISSPACE(*p))
          p++;
        tp = p;
        hdr = get_param_word(&p, &endpos, endchar);
        /* If not quoted, strip trailing spaces. */
        if(hdr == tp)
          while(endpos > hdr && ISSPACE(endpos[-1]))
            endpos--;
        sep = *p;
        *endpos = '\0';
        if(slist_append(&headers, hdr)) {
          fprintf(config->global->errors, "Out of memory for field header!\n");
          curl_slist_free_all(headers);
          return -1;
        }
      }
    }
    else if(checkprefix("encoder=", p)) {
      if(endct) {
        *endct = '\0';
        endct = NULL;
      }
      for(p += 8; ISSPACE(*p); p++)
        ;
      tp = p;
      encoder = get_param_word(&p, &endpos, endchar);
      /* If not quoted, strip trailing spaces. */
      if(encoder == tp)
        while(endpos > encoder && ISSPACE(endpos[-1]))
          endpos--;
      sep = *p;
      *endpos = '\0';
    }
    else if(endct) {
      /* This is part of content type. */
      for(endct = p; *p && *p != ';' && *p != endchar; p++)
        if(!ISSPACE(*p))
          endct = p + 1;
      sep = *p;
    }
    else {
      /* unknown prefix, skip to next block */
      char *unknown = get_param_word(&p, &endpos, endchar);

      sep = *p;
      *endpos = '\0';
      if(*unknown)
        warnf(config->global, "skip unknown form field: %s\n", unknown);
    }
  }

  /* Terminate content type. */
  if(endct)
    *endct = '\0';

  if(ptype)
    *ptype = type;
  else if(type)
    warnf(config->global, "Field content type not allowed here: %s\n", type);

  if(pfilename)
    *pfilename = filename;
  else if(filename)
    warnf(config->global,
          "Field file name not allowed here: %s\n", filename);

  if(pencoder)
    *pencoder = encoder;
  else if(encoder)
    warnf(config->global,
          "Field encoder not allowed here: %s\n", encoder);

  if(pheaders)
    *pheaders = headers;
  else if(headers) {
    warnf(config->global,
          "Field headers not allowed here: %s\n", headers->data);
    curl_slist_free_all(headers);
  }

  *str = p;
  return sep & 0xFF;
}